

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O0

pair<spvtools::EnumSet<spv::Capability>,_spvtools::EnumSet<spvtools::Extension>_> * __thiscall
spvtools::opt::TrimCapabilitiesPass::DetermineRequiredCapabilitiesAndExtensions
          (pair<spvtools::EnumSet<spv::Capability>,_spvtools::EnumSet<spvtools::Extension>_>
           *__return_storage_ptr__,TrimCapabilitiesPass *this)

{
  bool bVar1;
  Capability CVar2;
  Module *this_00;
  undefined1 local_108 [4];
  Capability capability_1;
  iterator __end2_1;
  iterator __begin2_1;
  CapabilitySet *__range2_1;
  undefined1 local_c8 [4];
  Capability capability;
  iterator __end2;
  iterator __begin2;
  CapabilitySet *__range2;
  CapabilitySet *local_88;
  ExtensionSet *local_80;
  function<void_(spvtools::opt::Instruction_*)> local_78;
  undefined1 local_58 [8];
  ExtensionSet required_extensions;
  CapabilitySet required_capabilities;
  TrimCapabilitiesPass *this_local;
  
  EnumSet<spv::Capability>::EnumSet((EnumSet<spv::Capability> *)&required_extensions.size_);
  EnumSet<spvtools::Extension>::EnumSet((EnumSet<spvtools::Extension> *)local_58);
  this_00 = Pass::get_module(&this->super_Pass);
  local_88 = (CapabilitySet *)&required_extensions.size_;
  local_80 = (ExtensionSet *)local_58;
  __range2 = (CapabilitySet *)this;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::TrimCapabilitiesPass::DetermineRequiredCapabilitiesAndExtensions()const::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_78,
             (anon_class_24_3_3d2ab1b1 *)&__range2);
  Module::ForEachInst(this_00,&local_78,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_78);
  EnumSet<spv::Capability>::begin
            ((iterator *)&__end2.bucketOffset_,
             (EnumSet<spv::Capability> *)&required_extensions.size_);
  EnumSet<spv::Capability>::end
            ((iterator *)local_c8,(EnumSet<spv::Capability> *)&required_extensions.size_);
  while (bVar1 = EnumSet<spv::Capability>::Iterator::operator!=
                           ((Iterator *)&__end2.bucketOffset_,(Iterator *)local_c8), bVar1) {
    CVar2 = EnumSet<spv::Capability>::Iterator::operator*((Iterator *)&__end2.bucketOffset_);
    AddExtensionsForOperand(this,SPV_OPERAND_TYPE_CAPABILITY,CVar2,(ExtensionSet *)local_58);
    EnumSet<spv::Capability>::Iterator::operator++((Iterator *)&__end2.bucketOffset_);
  }
  EnumSet<spv::Capability>::begin
            ((iterator *)&__end2_1.bucketOffset_,
             (EnumSet<spv::Capability> *)&required_extensions.size_);
  EnumSet<spv::Capability>::end
            ((iterator *)local_108,(EnumSet<spv::Capability> *)&required_extensions.size_);
  while( true ) {
    bVar1 = EnumSet<spv::Capability>::Iterator::operator!=
                      ((Iterator *)&__end2_1.bucketOffset_,(Iterator *)local_108);
    if (!bVar1) {
      std::make_pair<spvtools::EnumSet<spv::Capability>,spvtools::EnumSet<spvtools::Extension>>
                (__return_storage_ptr__,(EnumSet<spv::Capability> *)&required_extensions.size_,
                 (EnumSet<spvtools::Extension> *)local_58);
      EnumSet<spvtools::Extension>::~EnumSet((EnumSet<spvtools::Extension> *)local_58);
      EnumSet<spv::Capability>::~EnumSet((EnumSet<spv::Capability> *)&required_extensions.size_);
      return __return_storage_ptr__;
    }
    CVar2 = EnumSet<spv::Capability>::Iterator::operator*((Iterator *)&__end2_1.bucketOffset_);
    bVar1 = EnumSet<spv::Capability>::contains(&this->supportedCapabilities_,CVar2);
    if (!bVar1) break;
    EnumSet<spv::Capability>::Iterator::operator++((Iterator *)&__end2_1.bucketOffset_);
  }
  __assert_fail("supportedCapabilities_.contains(capability) && \"Module is using a capability that is not listed as supported.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                ,0x287,
                "std::pair<CapabilitySet, ExtensionSet> spvtools::opt::TrimCapabilitiesPass::DetermineRequiredCapabilitiesAndExtensions() const"
               );
}

Assistant:

std::pair<CapabilitySet, ExtensionSet>
TrimCapabilitiesPass::DetermineRequiredCapabilitiesAndExtensions() const {
  CapabilitySet required_capabilities;
  ExtensionSet required_extensions;

  get_module()->ForEachInst([&](Instruction* instruction) {
    addInstructionRequirements(instruction, &required_capabilities,
                               &required_extensions);
  });

  for (auto capability : required_capabilities) {
    AddExtensionsForOperand(SPV_OPERAND_TYPE_CAPABILITY,
                            static_cast<uint32_t>(capability),
                            &required_extensions);
  }

#if !defined(NDEBUG)
  // Debug only. We check the outputted required capabilities against the
  // supported capabilities list. The supported capabilities list is useful for
  // API users to quickly determine if they can use the pass or not. But this
  // list has to remain up-to-date with the pass code. If we can detect a
  // capability as required, but it's not listed, it means the list is
  // out-of-sync. This method is not ideal, but should cover most cases.
  {
    for (auto capability : required_capabilities) {
      assert(supportedCapabilities_.contains(capability) &&
             "Module is using a capability that is not listed as supported.");
    }
  }
#endif

  return std::make_pair(std::move(required_capabilities),
                        std::move(required_extensions));
}